

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlReadFile(char *filename,char *encoding,int options)

{
  htmlParserCtxtPtr ctxt_00;
  htmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *filename_local;
  
  xmlInitParser();
  ctxt_00 = htmlCreateFileParserCtxt(filename,encoding);
  if (ctxt_00 == (htmlParserCtxtPtr)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)htmlDoRead(ctxt_00,(char *)0x0,(char *)0x0,options,0);
  }
  return (htmlDocPtr)filename_local;
}

Assistant:

htmlDocPtr
htmlReadFile(const char *filename, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;

    xmlInitParser();
    ctxt = htmlCreateFileParserCtxt(filename, encoding);
    if (ctxt == NULL)
        return (NULL);
    return (htmlDoRead(ctxt, NULL, NULL, options, 0));
}